

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O2

char * utf8_iterate(char *buffer,size_t bufsize,int32_t *codepoint)

{
  byte byte;
  size_t size;
  size_t sVar1;
  int32_t value;
  uint local_2c;
  
  if (bufsize == 0) {
    return buffer;
  }
  byte = *buffer;
  size = utf8_check_first(byte);
  if (size == 0) {
    return (char *)0x0;
  }
  if (size == 1) {
    local_2c = (uint)byte;
  }
  else {
    if (bufsize < size) {
      return (char *)0x0;
    }
    sVar1 = utf8_check_full(buffer,size,(int32_t *)&local_2c);
    if (sVar1 == 0) {
      return (char *)0x0;
    }
  }
  if (codepoint != (int32_t *)0x0) {
    *codepoint = local_2c;
  }
  return buffer + size;
}

Assistant:

const char *utf8_iterate(const char *buffer, size_t bufsize, int32_t *codepoint) {
    size_t count;
    int32_t value;

    if (!bufsize)
        return buffer;

    count = utf8_check_first(buffer[0]);
    if (count <= 0)
        return NULL;

    if (count == 1)
        value = (unsigned char) buffer[0];
    else {
        if (count > bufsize || !utf8_check_full(buffer, count, &value))
            return NULL;
    }

    if (codepoint)
        *codepoint = value;

    return buffer + count;
}